

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ProcessTransfers(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  ObjectSymInfo *pOVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  BVSparseNode *pBVar7;
  BVSparseNode *pBVar8;
  PropertySym *pPVar9;
  BVSparse<Memory::JitArenaAllocator> local_78;
  BVSparse<Memory::JitArenaAllocator> local_58;
  
  if ((((this->tag == DeadStorePhase) &&
       (this->currentBlock->upwardExposedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
      (instr->m_opcode == Ld_A)) &&
     ((pSVar3 = IR::Opnd::GetStackSym(instr->m_dst), pSVar3 != (StackSym *)0x0 &&
      (pSVar3 = IR::Opnd::GetStackSym(instr->m_dst), (pSVar3->field_0x1a & 1) == 0)))) {
    pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
    bVar2 = StackSym::HasObjectInfo(pSVar3);
    if (((bVar2) &&
        ((instr->m_src1 != (Opnd *)0x0 &&
         (pSVar3 = IR::Opnd::GetStackSym(instr->m_src1), pSVar3 != (StackSym *)0x0)))) &&
       (pSVar3 = IR::Opnd::GetStackSym(instr->m_src1), (pSVar3->field_0x1a & 1) == 0)) {
      pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
      bVar2 = StackSym::HasObjectInfo(pSVar3);
      if (bVar2) {
        pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
        pOVar4 = StackSym::GetObjectInfo(pSVar3);
        pPVar9 = pOVar4->m_propertySymList;
        local_58.alloc = this->tempAlloc;
        local_58.lastUsedNodePrevNextField = &local_58.head;
        local_58.head = (BVSparseNode *)0x0;
        local_58.lastFoundIndex = (Type_conflict)0x0;
        if (pPVar9 != (PropertySym *)0x0) {
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          do {
            if (pPVar9->m_stackSym != pSVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1f98,"(dstPropertySym->m_stackSym == dstStackSym)",
                                 "dstPropertySym->m_stackSym == dstStackSym");
              if (!bVar2) goto LAB_003de9ed;
              *puVar5 = 0;
            }
            BVSparse<Memory::JitArenaAllocator>::Set(&local_58,(pPVar9->super_Sym).m_id);
            pPVar9 = pPVar9->m_nextInStackSymList;
          } while (pPVar9 != (PropertySym *)0x0);
        }
        pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
        pOVar4 = StackSym::GetObjectInfo(pSVar3);
        pPVar9 = pOVar4->m_propertySymList;
        local_78.alloc = this->tempAlloc;
        local_78.head = (BVSparseNode *)0x0;
        local_78.lastFoundIndex = (Type_conflict)0x0;
        if (pPVar9 == (PropertySym *)0x0) {
          local_78.head = (BVSparseNode *)0x0;
        }
        else {
          local_78.lastUsedNodePrevNextField = &local_78.head;
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          do {
            pBVar6 = &local_58;
            do {
              pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head;
              if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003de98a;
            } while (((Type *)&pBVar6->alloc)->word == 0);
            if (pPVar9->m_stackSym != pSVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1fa3,"(srcPropertySym->m_stackSym == srcStackSym)",
                                 "srcPropertySym->m_stackSym == srcStackSym");
              if (!bVar2) {
LAB_003de9ed:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar5 = 0;
            }
            if (pPVar9->m_propertyEquivSet != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              BVSparse<Memory::JitArenaAllocator>::And
                        (&local_78,&local_58,pPVar9->m_propertyEquivSet);
              pBVar6 = &local_78;
              do {
                pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head;
                if (pBVar6 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003de975;
              } while (((Type *)&pBVar6->alloc)->word == 0);
              BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                        (&local_58,&local_78);
              BVSparse<Memory::JitArenaAllocator>::Set
                        (this->currentBlock->upwardExposedFields,(pPVar9->super_Sym).m_id);
            }
LAB_003de975:
            pPVar9 = pPVar9->m_nextInStackSymList;
          } while (pPVar9 != (PropertySym *)0x0);
        }
LAB_003de98a:
        if (local_78.head != (BVSparseNode *)0x0) {
          pBVar8 = (local_78.alloc)->bvFreeList;
          do {
            pBVar7 = local_78.head;
            local_78.head = pBVar7->next;
            pBVar7->next = pBVar8;
            pBVar8 = pBVar7;
          } while (local_78.head != (Type)0x0);
          (local_78.alloc)->bvFreeList = pBVar7;
        }
        if (local_58.head != (BVSparseNode *)0x0) {
          pBVar8 = (local_58.alloc)->bvFreeList;
          do {
            pBVar7 = local_58.head;
            local_58.head = pBVar7->next;
            pBVar7->next = pBVar8;
            pBVar8 = pBVar7;
          } while (local_58.head != (Type)0x0);
          (local_58.alloc)->bvFreeList = pBVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessTransfers(IR::Instr * instr)
{
    if (this->tag == Js::DeadStorePhase &&
        this->currentBlock->upwardExposedFields &&
        instr->m_opcode == Js::OpCode::Ld_A &&
        instr->GetDst()->GetStackSym() &&
        !instr->GetDst()->GetStackSym()->IsTypeSpec() &&
        instr->GetDst()->GetStackSym()->HasObjectInfo() &&
        instr->GetSrc1() &&
        instr->GetSrc1()->GetStackSym() &&
        !instr->GetSrc1()->GetStackSym()->IsTypeSpec() &&
        instr->GetSrc1()->GetStackSym()->HasObjectInfo())
    {
        StackSym * dstStackSym = instr->GetDst()->GetStackSym();
        PropertySym * dstPropertySym = dstStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> transferFields(this->tempAlloc);
        while (dstPropertySym != nullptr)
        {
            Assert(dstPropertySym->m_stackSym == dstStackSym);
            transferFields.Set(dstPropertySym->m_id);
            dstPropertySym = dstPropertySym->m_nextInStackSymList;
        }

        StackSym * srcStackSym = instr->GetSrc1()->GetStackSym();
        PropertySym * srcPropertySym = srcStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> equivFields(this->tempAlloc);

        while (srcPropertySym != nullptr && !transferFields.IsEmpty())
        {
            Assert(srcPropertySym->m_stackSym == srcStackSym);
            if (srcPropertySym->m_propertyEquivSet)
            {
                equivFields.And(&transferFields, srcPropertySym->m_propertyEquivSet);
                if (!equivFields.IsEmpty())
                {
                    transferFields.Minus(&equivFields);
                    this->currentBlock->upwardExposedFields->Set(srcPropertySym->m_id);
                }
            }
            srcPropertySym = srcPropertySym->m_nextInStackSymList;
        }
    }
}